

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

int pnga_deregister_type(int type)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = -1;
  if (0x3f8 < type) {
    uVar2 = type - 1000;
    if (ga_types[uVar2].active == 0) {
      return -2;
    }
    ga_types[uVar2].active = 0;
    ga_types[uVar2].size = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int pnga_deregister_type(int type) {
  int tp = type-MT_BASE;
  if(tp<GA_TYPES_RESERVED) {
    return -1;
  }
  if(ga_types[tp].active==0) {
    return -2;
  }
  ga_types[tp].active = 0;
  ga_types[tp].size = 0;
  return 0;  
}